

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeEDSK.cpp
# Opt level: O2

int __thiscall
FormatTypeEDSK::LoadDisk
          (FormatTypeEDSK *this,uchar *buffer,size_t size,IDisk **created_disk,
          ILoadingProgress *loading_progress)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  IDisk *this_00;
  Track *pTVar4;
  MFMTrack *pMVar5;
  long lVar6;
  ulong uVar7;
  Sector *pSVar8;
  void *pvVar9;
  void *__dest;
  ulong *puVar10;
  undefined8 *puVar11;
  byte *pbVar12;
  ulong uVar13;
  int *piVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  byte *pbVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  uchar *puVar23;
  Side *pSVar24;
  ulong uVar25;
  int local_a4;
  Track trk;
  
  if (*(long *)buffer == 0x4445444e45545845) {
    this_00 = (IDisk *)operator_new(0x68);
    IDisk::IDisk(this_00);
    bVar1 = buffer[0x30];
    uVar21 = 2;
    if (buffer[0x31] < 2) {
      uVar21 = (ulong)buffer[0x31];
    }
    uVar15 = (ulong)bVar1;
    this_00->nb_sides_ = (uchar)uVar21;
    uVar13 = uVar15 * 0x28;
    uVar16 = 0x2a;
    if (0x2a < bVar1) {
      uVar16 = (uint)bVar1;
    }
    pbVar18 = buffer + 0x34;
    for (uVar7 = 0; uVar7 != uVar21; uVar7 = uVar7 + 1) {
      this->side_[uVar7].nb_tracks = bVar1;
      this_00->side_[uVar7].nb_tracks = (uint)bVar1;
      pTVar4 = (Track *)operator_new__(uVar13);
      this->side_[uVar7].tracks = pTVar4;
      pMVar5 = (MFMTrack *)operator_new__((ulong)(uVar16 << 5));
      this_00->side_[uVar7].tracks = pMVar5;
      memset(pMVar5,0,(ulong)bVar1 << 5);
      memset(pTVar4,0,uVar13);
      pbVar12 = pbVar18;
      for (lVar6 = 0; uVar13 - lVar6 != 0; lVar6 = lVar6 + 0x28) {
        *(uint *)((long)&pTVar4->track_size + lVar6) = (uint)*pbVar12 << 8;
        pbVar12 = pbVar12 + uVar21;
      }
      pbVar18 = pbVar18 + 1;
    }
    uVar7 = 0x100;
    for (uVar13 = 0; uVar13 != uVar15; uVar13 = uVar13 + 1) {
      for (uVar25 = 0; uVar25 < uVar21; uVar25 = uVar25 + 1) {
        pTVar4 = this->side_[uVar25].tracks;
        if (pTVar4[uVar13].track_size < 0x101) {
          uVar16 = (int)uVar7 + pTVar4[uVar13].track_size;
          pTVar4[uVar13].formatted = false;
        }
        else {
          pTVar4[uVar13].formatted = true;
          puVar23 = buffer + uVar7;
          iVar3 = bcmp(puVar23,"Track-Info",10);
          if (iVar3 != 0) {
            (*this_00->_vptr_IDisk[1])();
            return -2;
          }
          bVar1 = puVar23[0x14];
          uVar16 = (int)uVar7 + 0x100;
          pTVar4[uVar13].sz = bVar1;
          pTVar4[uVar13].sector_size = 0x80 << (bVar1 & 0x1f);
          bVar1 = puVar23[0x15];
          pTVar4[uVar13].nb_sector = (uint)bVar1;
          pTVar4[uVar13].gap3 = puVar23[0x16];
          pTVar4[uVar13].gap3_filler = 'N';
          pSVar8 = (Sector *)operator_new__((ulong)bVar1 * 0x1d0);
          pTVar4[uVar13].sectors = pSVar8;
          lVar6 = 0;
          local_a4 = 0x100;
          iVar22 = 0x18;
          iVar3 = 0;
          uVar19 = 0;
          for (uVar21 = 0; uVar21 < pTVar4[uVar13].nb_sector; uVar21 = uVar21 + 1) {
            memset((pTVar4[uVar13].sectors)->mfm_chrn + lVar6 + -0x18,0,0x1d0);
            if (0x100U - iVar22 < iVar3 * 8 + 8U) {
              puVar23 = buffer + uVar16;
              uVar16 = uVar16 + 0x100;
              local_a4 = local_a4 + 0x100;
              iVar22 = 0;
              iVar3 = 0;
            }
            pTVar4 = this->side_[uVar25].tracks;
            pSVar8 = pTVar4[uVar13].sectors;
            pSVar8->mfm_chrn[lVar6 + -0x18] = puVar23[(uint)(iVar22 + iVar3 * 8)];
            pSVar8->mfm_chrn[lVar6 + -0x17] = puVar23[(uint)(iVar22 + 1 + iVar3 * 8)];
            pSVar8->mfm_chrn[lVar6 + -0x16] = puVar23[(uint)(iVar22 + 2 + iVar3 * 8)];
            pSVar8->mfm_chrn[lVar6 + -0x15] = puVar23[(uint)(iVar22 + 3 + iVar3 * 8)];
            pSVar8->mfm_chrn[lVar6 + -0x14] = puVar23[(uint)(iVar22 + 4 + iVar3 * 8)];
            pSVar8->mfm_chrn[lVar6 + -0x13] = puVar23[(uint)(iVar22 + 5 + iVar3 * 8)];
            bVar1 = puVar23[(uint)(iVar22 + 6 + iVar3 * 8)];
            *(ushort *)(pSVar8->mfm_chrn + lVar6 + -0x12) = (ushort)bVar1;
            uVar2 = CONCAT11(puVar23[iVar22 + iVar3 * 8 + 7],bVar1);
            *(ushort *)(pSVar8->mfm_chrn + lVar6 + -0x12) = uVar2;
            uVar19 = uVar19 + uVar2;
            iVar3 = iVar3 + 1;
            lVar6 = lVar6 + 0x1d0;
          }
          piVar14 = &pTVar4[uVar13].track_size;
          if ((uVar19 < 0xff01) || (uVar19 <= (uint)(*piVar14 - local_a4))) {
            pvVar9 = operator_new__((ulong)(uint)(*piVar14 - local_a4));
            memcpy(pvVar9,buffer + uVar16,(ulong)(uint)(*piVar14 - local_a4));
            local_a4 = *piVar14 - local_a4;
          }
          else {
            uVar19 = uVar19 + 0xff & 0xffffff00;
            *piVar14 = uVar19;
            pvVar9 = operator_new__((long)(int)uVar19);
            memcpy(pvVar9,buffer + uVar16,(long)*piVar14);
            local_a4 = *piVar14;
          }
          lVar6 = 6;
          uVar21 = 0;
          for (uVar7 = 0; uVar7 < pTVar4[uVar13].nb_sector; uVar7 = uVar7 + 1) {
            uVar20 = (ulong)*(ushort *)((pTVar4[uVar13].sectors)->mfm_chrn + lVar6 + -0x18);
            if (uVar20 == 0) {
              puVar23 = (pTVar4[uVar13].sectors)->mfm_chrn + lVar6 + -0xe;
              puVar23[0] = '\0';
              puVar23[1] = '\0';
              puVar23[2] = '\0';
              puVar23[3] = '\0';
              puVar23[4] = '\0';
              puVar23[5] = '\0';
              puVar23[6] = '\0';
              puVar23[7] = '\0';
            }
            else {
              __dest = operator_new__(uVar20);
              pSVar8 = pTVar4[uVar13].sectors;
              *(void **)(pSVar8->mfm_chrn + lVar6 + -0xe) = __dest;
              memcpy(__dest,(void *)(uVar21 + (long)pvVar9),
                     (ulong)*(ushort *)(pSVar8->mfm_chrn + lVar6 + -0x18));
              uVar21 = (ulong)((int)uVar21 +
                              (uint)*(ushort *)((pTVar4[uVar13].sectors)->mfm_chrn + lVar6 + -0x18))
              ;
            }
            lVar6 = lVar6 + 0x1d0;
          }
          uVar16 = uVar16 + local_a4;
          operator_delete__(pvVar9);
          uVar21 = (ulong)this_00->nb_sides_;
        }
        uVar7 = (ulong)uVar16;
      }
    }
    if ((((int)uVar7 != 0) && (uVar13 = (ulong)((int)uVar7 + 0xf), uVar13 < size)) &&
       (iVar3 = bcmp(buffer + uVar7,"Offset-Info\r\n",0xe), iVar3 == 0)) {
      this->extended_offset_ = true;
      for (uVar7 = 0; uVar7 != uVar21; uVar7 = uVar7 + 1) {
        for (uVar25 = 0; uVar25 != uVar15; uVar25 = uVar25 + 1) {
          pTVar4 = this->side_[uVar7].tracks;
          uVar16 = pTVar4[uVar25].nb_sector;
          uVar19 = (uint)uVar13;
          lVar6 = 0;
          while( true ) {
            uVar19 = uVar19 + 2;
            uVar13 = (ulong)uVar19;
            if ((ulong)uVar16 * 0xe8 - lVar6 == 0) break;
            *(undefined2 *)((pTVar4[uVar25].sectors)->mfm_chrn + lVar6 * 2 + -0x10) =
                 *(undefined2 *)(buffer + uVar13);
            lVar6 = lVar6 + 0xe8;
          }
        }
      }
    }
    for (uVar15 = 0; uVar15 < uVar21; uVar15 = uVar15 + 1) {
      pSVar24 = this_00->side_ + uVar15;
      for (uVar21 = 0; uVar21 < pSVar24->nb_tracks; uVar21 = uVar21 + 1) {
        iVar3 = (int)uVar15;
        iVar22 = (int)uVar21;
        uVar16 = GetNbRevolutions(this,iVar3,iVar22);
        pMVar5 = pSVar24->tracks;
        pMVar5[uVar21].nb_revolutions = uVar16;
        lVar17 = (ulong)uVar16 * 0x30;
        puVar10 = (ulong *)operator_new__(lVar17 + 8);
        *puVar10 = (ulong)uVar16;
        lVar6 = 0;
        do {
          *(undefined8 *)((long)puVar10 + lVar6 + 0x28) = 0;
          puVar11 = (undefined8 *)((long)puVar10 + lVar6 + 0x18);
          *puVar11 = 0;
          puVar11[1] = 0;
          lVar6 = lVar6 + 0x30;
        } while (lVar17 - lVar6 != 0);
        pMVar5[uVar21].revolution = (Revolution *)(puVar10 + 1);
        for (uVar16 = 0; uVar16 < pMVar5[uVar21].nb_revolutions; uVar16 = uVar16 + 1) {
          FillTrackMfm(this,this_00,iVar3,iVar22,uVar16);
          trk.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x0;
          trk.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x0;
          trk.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          IDisk::GetTrackInfoForRev(this_00,iVar3,iVar22,&trk,0);
          std::_Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>::~_Vector_base
                    ((_Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_> *)&trk);
          pMVar5 = pSVar24->tracks;
        }
      }
      uVar21 = (ulong)this_00->nb_sides_;
    }
    for (uVar15 = 0; uVar15 != uVar21; uVar15 = uVar15 + 1) {
      uVar16 = this_00->side_[uVar15].nb_tracks;
      uVar13 = (ulong)uVar16;
      lVar6 = uVar13 << 5;
      for (; uVar13 < 0x2a; uVar13 = uVar13 + 1) {
        pMVar5 = this_00->side_[uVar15].tracks;
        *(undefined4 *)((long)&pMVar5->nb_revolutions + lVar6) = 1;
        puVar11 = (undefined8 *)operator_new__(0x38);
        *puVar11 = 1;
        puVar11[5] = 0;
        puVar11[3] = 0;
        puVar11[4] = 0;
        *(undefined8 **)((long)&pMVar5->revolution + lVar6) = puVar11 + 1;
        *(undefined4 *)(puVar11 + 2) = 0x40000;
        pvVar9 = operator_new__(0x40000);
        **(undefined8 **)((long)&pMVar5->revolution + lVar6) = pvVar9;
        memset(pvVar9,0,0x40000);
        lVar6 = lVar6 + 0x20;
      }
      if (uVar16 < 0x2a) {
        this_00->side_[uVar15].nb_tracks = 0x2a;
      }
    }
    (*this_00->_vptr_IDisk[0x14])(this_00);
    *created_disk = this_00;
    iVar3 = 0;
  }
  else {
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int FormatTypeEDSK::LoadDisk(const unsigned char* buffer, size_t size, IDisk*& created_disk,
                             ILoadingProgress* loading_progress)
{
   if (memcmp(buffer, "EXTENDED", 8) == 0)
   {
      IDisk* new_disk = new IDisk();

      // Extended
      // Name of creator : don't read
      // Number of tracks, and sides
      int m_NbTracks = buffer[0x30];
      new_disk->nb_sides_ = buffer[0x31];

      if (new_disk->nb_sides_ > 2)
      {
         // ERROR ! - TODO
         new_disk->nb_sides_ = 2;
      }

      // Track size table
      // Format disk on memory
      int i, j;
      unsigned int k;
      for (i = 0; i < new_disk->nb_sides_; i++)
      {
         unsigned int offset = 0x34 + i;
         side_[i].nb_tracks = m_NbTracks;
         new_disk->side_[i].nb_tracks = m_NbTracks;
         side_[i].tracks = new Track[m_NbTracks];
         new_disk->side_[i].tracks = new IDisk::MFMTrack[m_NbTracks < 42 ? 42 : m_NbTracks];
         memset(new_disk->side_[i].tracks, 0, (sizeof(IDisk::MFMTrack)) * m_NbTracks);
         memset(side_[i].tracks, 0, (sizeof(Track)) * m_NbTracks);
         for (j = 0; j < m_NbTracks; j++)
         {
            side_[i].tracks[j].track_size = (buffer[offset] << 8);
            //m_Side [i].Tracks[j].Formatted = ( header[offset] != 0);
            offset += new_disk->nb_sides_;
         }
      }
      unsigned int index_header = 0x100;

      for (j = 0; j < m_NbTracks; j++)
      {
         for (i = 0; i < new_disk->nb_sides_; i++)
         {
            // Formatted ?
            const unsigned char* header = buffer;

            if (side_[i].tracks[j].track_size > 0x100)
            {
               side_[i].tracks[j].formatted = true;

               header = &buffer[index_header];
               index_header += 0x100;
               //fread(header, 0x100, 1, file);

               if (memcmp(header, "Track-Info", 10) != 0)
               {
                  delete new_disk;
                  new_disk = nullptr;
                  return -2;
               }

               unsigned int size_to_remove_for_sector = 0x100;
               unsigned int offset_from_start = 0x18;
               //unsigned char* track_block = new unsigned char [m_Side[i].Tracks [j].TrackSize];
               //fread ( track_block, m_Side[i].Tracks [j].TrackSize-0x100, 1, file );
               // Track number
               unsigned int tn = header[0x10];
               if (tn != j)
               {
                  // bug...
                  //tn = m_NbTracks-1;
                  tn = j;
               }
               // Side number
               //i = header[0x11]; - Check this !
               if (i != header[0x11])
               {
               }
               unsigned char sectorSize_L = side_[i].tracks[tn].sz = header[0x14];
               side_[i].tracks[tn].sector_size = (0x80 << sectorSize_L);
               // Number of sector
               side_[i].tracks[tn].nb_sector = header[0x15];
               side_[i].tracks[tn].gap3 = header[0x16];
               side_[i].tracks[tn].gap3_filler = 0x4E; // header [0x17];
               side_[i].tracks[tn].sectors = new Sector[side_[i].tracks[tn].nb_sector];
               // Sector info
               unsigned int count = 0;
               unsigned int offset = 0;
               unsigned int total_size = 0;

               for (k = 0; k < side_[i].tracks[tn].nb_sector; k++)
               {
                  memset(&side_[i].tracks[tn].sectors[k], 0x00, sizeof(Sector));

                  // Get next 0x100 bytes ?
                  if ((count + 1) * 8 > 0x100 - offset_from_start)
                  {
                     // Get next 0x100 bytes
                     //memcpy ( &header[0x18], track_block, 0x100-0x18 );
                     //fread(header, 0x100, 1, file);
                     header = &buffer[index_header];
                     index_header += 0x100;

                     size_to_remove_for_sector += 0x100;
                     offset_from_start = 0;
                     count = 0;
                  }
                  side_[i].tracks[tn].sectors[k].track = header[offset_from_start + count * 8 + 00];
                  side_[i].tracks[tn].sectors[k].side = header[offset_from_start + count * 8 + 01];
                  side_[i].tracks[tn].sectors[k].sector_id = header[offset_from_start + count * 8 + 02];
                  side_[i].tracks[tn].sectors[k].sector_size = header[offset_from_start + count * 8 + 03];
                  side_[i].tracks[tn].sectors[k].fdc_status_1 = header[offset_from_start + count * 8 + 04];
                  side_[i].tracks[tn].sectors[k].fdc_status_2 = header[offset_from_start + count * 8 + 05];
                  side_[i].tracks[tn].sectors[k].actual_size = header[offset_from_start + count * 8 + 06];
                  side_[i].tracks[tn].sectors[k].actual_size += header[offset_from_start + count * 8 + 07] * 256;
                  total_size += side_[i].tracks[tn].sectors[k].actual_size;
                  count++;
               }

               unsigned char* track_block = NULL;

               if (total_size > side_[i].tracks[j].track_size - size_to_remove_for_sector && total_size > 0xFF00)
               {
                  // "total_size" should be at last a multiple of 0x100
                  if ((total_size & 0xFF) != 0)
                  {
                     total_size += (0x100 - (total_size & 0xFF));
                  }
                  // Set the totalsize as a
                  side_[i].tracks[j].track_size = total_size;
                  track_block = new unsigned char[side_[i].tracks[j].track_size];
                  memcpy(track_block, &buffer[index_header], side_[i].tracks[j].track_size);
                  index_header += side_[i].tracks[j].track_size;
               }
               else
               {
                  track_block = new unsigned char[side_[i].tracks[j].track_size - size_to_remove_for_sector];

                  memcpy(track_block, &buffer[index_header], side_[i].tracks[j].track_size - size_to_remove_for_sector);
                  index_header += (side_[i].tracks[j].track_size - size_to_remove_for_sector);
               }

               // Data
               if (tn == 0x13)
               {
                  int dbg = 1;
               }
               for (k = 0; k < side_[i].tracks[tn].nb_sector; k++)
               {
                  if (side_[i].tracks[tn].sectors[k].actual_size == 0)
                  {
                     side_[i].tracks[tn].sectors[k].data = NULL;
                  }
                  else
                  {
                     side_[i].tracks[tn].sectors[k].data = new unsigned char[side_[i].tracks[tn].sectors[k].actual_size
                     ];
                     memcpy(side_[i].tracks[tn].sectors[k].data, &track_block[offset],
                            side_[i].tracks[tn].sectors[k].actual_size);
                     offset += side_[i].tracks[tn].sectors[k].actual_size;
                  }
               }
               delete[]track_block;
            }
            else
            {
               header = &buffer[index_header];
               index_header += side_[i].tracks[j].track_size;
               side_[i].tracks[j].formatted = false;
            }
         }
      }

      // Extension ? Offset-Info ?
      if (index_header > 0 && index_header + 0x0F < size)
      {
         unsigned char sector_index_buffer[2];
         //if (memcmp(header, "Offset-Info\r\n", 0x0E) == 0)
         if (memcmp(&buffer[index_header], "Offset-Info\r\n", 0x0E) == 0)
         {
            index_header += 0x0F;
            extended_offset_ = true;
            // OFFSET EXT.
            // For each track
            for (int side = 0; side < new_disk->nb_sides_; side++)
            {
               for (i = 0; i < m_NbTracks; i++)
               {
                  // Read track length
                  //fread(sector_index_buffer, 1, 2, file);
                  memcpy(sector_index_buffer, &buffer[index_header], 2);
                  index_header += 2;
                  // For each sector
                  for (k = 0; k < side_[side].tracks[i].nb_sector; k++)
                  {
                     // Read offset
                     //fread(sector_index_buffer, 1, 2, file);
                     memcpy(sector_index_buffer, &buffer[index_header], 2);
                     index_header += 2;

                     side_[side].tracks[i].sectors[k].sector_index = sector_index_buffer[0] + (sector_index_buffer[1] << 8);
                  }
               }
            }
         }
         else
         {
            //fseek(file, -0x0F, SEEK_CUR);
         }
      }

      for (int side = 0; side < new_disk->nb_sides_; side++)
      {
         for (unsigned int track = 0; track < new_disk->side_[side].nb_tracks; track++)
         {
            // Fill tracks
            unsigned int nb_revolutions = GetNbRevolutions(side, track);
            //unsigned int size = FillTrack (  side, track, NULL, 1 );
            new_disk->side_[side].tracks[track].nb_revolutions = nb_revolutions;
            new_disk->side_[side].tracks[track].revolution = new IDisk::Revolution[nb_revolutions];

            for (unsigned int rev = 0; rev < new_disk->side_[side].tracks[track].nb_revolutions; rev++)
            {
               FillTrackMfm(new_disk, side, track, rev);

               IDisk::Track trk;
               LOG("TRACK ");
               LOG(i);
               LOGEOL
               new_disk->GetTrackInfoForRev(side, track, &trk);
               LOGEOL
            }
         }
      }

      // Complete to 42 tracks
      for (int side = 0; side < new_disk->nb_sides_; side++)
      {
         for (unsigned int track = new_disk->side_[side].nb_tracks; track < 42; track++)
         {
            new_disk->side_[side].tracks[track].nb_revolutions = 1; // Only one for DSK files
            new_disk->side_[side].tracks[track].revolution = new IDisk::Revolution[1];

            new_disk->side_[side].tracks[track].revolution[0].size = DEFAULT_TRACK_SIZE * 16;
            new_disk->side_[side].tracks[track].revolution[0].bitfield = new unsigned char[DEFAULT_TRACK_SIZE * 16];
            memset(new_disk->side_[side].tracks[track].revolution[0].bitfield, 0, DEFAULT_TRACK_SIZE * 16);
         }
         if (new_disk->side_[side].nb_tracks < 42)
            new_disk->side_[side].nb_tracks = 42;
      }

      new_disk->CreateTrackFromMultiRevolutions();

      created_disk = new_disk;

      return OK;
   }
   else
   {
      return FILE_ERROR;
   }
}